

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSpecConstantTests.cpp
# Opt level: O2

SpecConstant *
vkt::pipeline::anon_unknown_0::composite_case_internal::makeSpecConstant
          (SpecConstant *__return_storage_ptr__,string *specConstName,deUint32 specConstId,
          DataType type,int specValue)

{
  deUint32 dVar1;
  char *__s;
  double dVar2;
  string typeName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  __s = glu::getDataTypeName(specConstId);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,__s,(allocator<char> *)&bStack_108);
  std::operator+(&local_e8,"layout(constant_id = ${ID}) const ",&local_48);
  std::operator+(&local_c8,&local_e8," ");
  std::operator+(&local_a8,&local_c8,specConstName);
  std::operator+(&local_88,&local_a8," = ");
  std::operator+(&bStack_108,&local_88,&local_48);
  std::operator+(&local_68,&bStack_108,"(1);");
  dVar1 = getDataTypeScalarSizeBytes(specConstId);
  if (specConstId == 1) {
    dVar2 = (double)(ulong)(uint)(float)(int)type;
  }
  else if (specConstId == 0xe) {
    dVar2 = (double)(int)type;
  }
  else {
    dVar2 = (double)(ulong)type;
  }
  __return_storage_ptr__->specID = 1;
  std::__cxx11::string::string
            ((string *)&__return_storage_ptr__->declarationCode,(string *)&local_68);
  __return_storage_ptr__->size = dVar1;
  (__return_storage_ptr__->specValue).m_data = (deUint64)dVar2;
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&bStack_108);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

SpecConstant makeSpecConstant (const std::string specConstName, const deUint32 specConstId, const glu::DataType type, const int specValue)
{
	DE_ASSERT(glu::isDataTypeScalar(type));

	const std::string typeName(glu::getDataTypeName(type));

	return SpecConstant(
		specConstId,
		"layout(constant_id = ${ID}) const " + typeName + " " + specConstName + " = " + typeName + "(1);",
		getDataTypeScalarSizeBytes(type), makeValue(type, specValue));
}